

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_astar.hpp
# Opt level: O0

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
compress::CompressAstar<Tiles>::search(CompressAstar<Tiles> *this,State *init)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  CompressClosedList<Node<Tiles>_> *in_RSI;
  PackedState in_RDI;
  Edge<Tiles> e;
  int op;
  int i;
  State parent_state;
  Node<Tiles> parent;
  State state;
  bool reopened;
  bool found;
  Node<Tiles> n;
  CompressClosedList<Node<Tiles>_> *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  uint in_stack_fffffffffffffedc;
  State *s;
  State *s_00;
  CompressAstar<Tiles> *in_stack_ffffffffffffff00;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *in_stack_ffffffffffffff18;
  CompressOpenList<Node<Tiles>_> *in_stack_ffffffffffffff20;
  Node<Tiles> *in_stack_ffffffffffffff28;
  CompressOpenList<Node<Tiles>_> *in_stack_ffffffffffffff30;
  int local_bc;
  Node<Tiles> *in_stack_ffffffffffffff58;
  CompressClosedList<Node<Tiles>_> *in_stack_ffffffffffffff60;
  State local_72 [2];
  pair<bool,_bool> local_4c;
  byte local_4a;
  byte local_49;
  char cStack_46;
  undefined8 local_48;
  PackedState local_40;
  PackedState local_38 [7];
  
  s_00 = (State *)&in_RSI[1].partition_hasher.table.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  s = (State *)in_RDI.word;
  wrap(in_stack_ffffffffffffff00,s_00,(Node<Tiles> *)in_RSI,(int)(in_RDI.word >> 0x20),
       (int)in_RDI.word);
  CompressOpenList<Node<Tiles>_>::push(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  while( true ) {
    do {
      bVar1 = CompressOpenList<Node<Tiles>_>::isempty
                        ((CompressOpenList<Node<Tiles>_> *)
                         &in_RSI[1].partition_hasher.table.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      in_stack_fffffffffffffedc = in_stack_fffffffffffffedc & 0xffffff;
      if (!bVar1) {
        sVar3 = std::vector<Tiles::State,_std::allocator<Tiles::State>_>::size
                          ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)
                           &in_RSI[1].internal_closed);
        in_stack_fffffffffffffedc = CONCAT13(sVar3 == 0,(int3)in_stack_fffffffffffffedc);
      }
      if ((char)(in_stack_fffffffffffffedc >> 0x18) == '\0') goto LAB_0010da4a;
      CompressOpenList<Node<Tiles>_>::pop(in_stack_ffffffffffffff20);
      local_4c = CompressClosedList<Node<Tiles>_>::find_insert
                           ((CompressClosedList<Node<Tiles>_> *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            (Node<Tiles> *)in_stack_fffffffffffffed0);
      std::tie<bool,bool>((bool *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          &in_stack_fffffffffffffed0->reopen_closed);
      std::tuple<bool&,bool&>::operator=
                ((tuple<bool_&,_bool_&> *)in_RDI.word,
                 (pair<bool,_bool> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if (((local_49 & 1) != 0) && ((local_4a & 1) != 0)) {
        (in_RSI->partition_hasher).table.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((long)&(((in_RSI->partition_hasher).table.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl + 1);
      }
    } while (((local_49 & 1) != 0) && ((local_4a & 1) == 0));
    Tiles::unpack((Tiles *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                  (State *)in_stack_fffffffffffffed0,in_RDI);
    bVar1 = Tiles::isgoal((Tiles *)(in_RSI->hasher).table.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_72);
    if (bVar1) break;
    (in_RSI->hasher).table.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)&(((in_RSI->hasher).table.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + 1);
    local_bc = 0;
    while (in_stack_fffffffffffffed8 = local_bc,
          iVar2 = Tiles::nops((Tiles *)(in_RSI->hasher).table.
                                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,local_72),
          in_stack_fffffffffffffed8 < iVar2) {
      iVar2 = Tiles::nthop((Tiles *)(in_RSI->hasher).table.
                                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,local_72,local_bc);
      if (iVar2 != cStack_46) {
        (in_RSI->hasher).table.
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&(((in_RSI->hasher).table.
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + 1);
        Tiles::apply((Tiles *)in_RSI,s,(int)(in_RDI.word >> 0x20));
        in_stack_fffffffffffffed0 =
             (CompressClosedList<Node<Tiles>_> *)
             &in_RSI[1].partition_hasher.table.
              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
        wrap(in_stack_ffffffffffffff00,s_00,(Node<Tiles> *)in_RSI,(int)((ulong)s >> 0x20),(int)s);
        CompressOpenList<Node<Tiles>_>::push(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        Tiles::undo((Tiles *)(in_RSI->hasher).table.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,local_72,
                    (Edge<Tiles> *)&stack0xffffffffffffff18);
      }
      local_bc = local_bc + 1;
    }
  }
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
            ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)in_RDI.word,
             (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (bVar1 = Tiles::PackedState::operator!=(local_38,&local_40), bVar1) {
    CompressClosedList<Node<Tiles>_>::trace_parent
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    Tiles::unpack((Tiles *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                  (State *)in_stack_fffffffffffffed0,in_RDI);
    std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back
              ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)in_RDI.word,
               (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  CompressClosedList<Node<Tiles>_>::print_statistics(in_RSI);
  CompressOpenList<Node<Tiles>_>::clear((CompressOpenList<Node<Tiles>_> *)in_stack_fffffffffffffed0)
  ;
  CompressClosedList<Node<Tiles>_>::clear(in_stack_fffffffffffffed0);
LAB_0010da4a:
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector
            ((vector<Tiles::State,_std::allocator<Tiles::State>_> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  return (vector<Tiles::State,_std::allocator<Tiles::State>_> *)s;
}

Assistant:

std::vector<typename D::State> search(typename D::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (!open.isempty() && path.size() == 0) {
                Node<D> n = open.pop();

                bool found, reopened;
                tie(found, reopened) = closed.find_insert(n);
                if (found && reopened) this->reopd++;
                if (found && !reopened) continue;

                typename D::State state;
                this->dom.unpack(state, n.packed);

                if (this->dom.isgoal(state)) {
                    // trace path here
                    path.push_back(state);
                    while(n.packed != n.parent_packed) {
                        Node<D> parent = closed.trace_parent(n);
                        typename D::State parent_state;
                        this->dom.unpack(parent_state, parent.packed);
                        path.push_back(parent_state);
                        n = parent;
                    }
                    closed.print_statistics();
                    open.clear();
                    closed.clear();
                    break;
                }

                this->expd++;
                for (int i = 0; i < this->dom.nops(state); i++) {
                    int op = this->dom.nthop(state, i);
                    if (op == n.pop)
                        continue;
                    this->gend++;
                    Edge<D> e = this->dom.apply(state, op);
                    open.push(wrap(state, &n, e.cost, e.pop));
                    this->dom.undo(state, e);
                }
            }
            return path;
        }